

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O1

void av1_filter_block_plane_vert_opt_chroma
               (AV1_COMMON *cm,MACROBLOCKD *xd,MACROBLOCKD_PLANE *plane_ptr,uint32_t mi_row,
               uint32_t mi_col,AV1_DEBLOCKING_PARAMETERS *params_buf,TX_SIZE *tx_buf,int plane,
               _Bool joint_filter_chroma,int num_mis_in_lpf_unit_height_log2)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  BLOCK_SIZE BVar3;
  uint uVar4;
  uint uVar5;
  aom_bit_depth_t bd;
  MB_MODE_INFO **ppMVar6;
  MB_MODE_INFO *pMVar7;
  MB_MODE_INFO *pMVar8;
  loop_filter_thresh *_blimit0;
  bool bVar9;
  uint16_t *s;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  byte bVar17;
  byte bVar18;
  loop_filter_info_n *lfi_n;
  uint uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  byte *pbVar23;
  uint8_t *puVar24;
  uint16_t *s_00;
  long lVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  uint uVar30;
  AV1_DEBLOCKING_PARAMETERS *pAVar31;
  uint8_t *dst_ptr;
  uint8_t *puVar32;
  USE_FILTER_TYPE use_filter_type;
  int iVar33;
  ulong uVar34;
  
  uVar4 = plane_ptr->subsampling_x;
  uVar5 = plane_ptr->subsampling_y;
  bVar17 = (byte)uVar4;
  bVar18 = (byte)uVar5;
  iVar22 = (((1 << (bVar18 & 0x1f)) >> 1) + (((plane_ptr->dst).height << (bVar18 & 0x1f)) + 3 >> 2)
           >> (bVar18 & 0x1f)) - (mi_row >> (bVar18 & 0x1f));
  iVar33 = (1 << ((byte)num_mis_in_lpf_unit_height_log2 & 0x1f)) >> (bVar18 & 0x1f);
  if (iVar22 < iVar33) {
    iVar33 = iVar22;
  }
  uVar30 = (((1 << (bVar17 & 0x1f)) >> 1) + (((plane_ptr->dst).width << (bVar17 & 0x1f)) + 3 >> 2)
           >> (bVar17 & 0x1f)) - (mi_col >> (bVar17 & 0x1f));
  uVar13 = 0x20 >> (bVar17 & 0x1f);
  if ((int)uVar30 < (int)uVar13) {
    uVar13 = uVar30;
  }
  if (0 < iVar33) {
    lVar25 = 1L << (bVar17 & 0x3f);
    iVar22 = (plane_ptr->dst).stride;
    lVar29 = (long)iVar22;
    uVar26 = (uVar13 << (bVar17 & 0x1f)) + mi_col;
    uVar27 = uVar4 | mi_col;
    lfi_n = &cm->lf_info;
    uVar30 = 0;
    do {
      params_buf->filter_length = '\0';
      uVar19 = (uVar30 << (bVar18 & 0x1f)) + mi_row | uVar5;
      uVar14 = (cm->mi_params).mi_stride * uVar19;
      ppMVar6 = (cm->mi_params).mi_grid_base;
      pMVar7 = ppMVar6[(ulong)uVar14 + (ulong)uVar27];
      if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar7->field_0xa7 & 7] == 0)) {
        if (plane == 0) {
          bVar12 = pMVar7->tx_size;
        }
        else {
          bVar10 = ""[av1_ss_size_lookup[pMVar7->bsize][(int)uVar4][(int)uVar5]];
          if (bVar10 < 0x11) {
            bVar12 = 3;
            if ((1 < bVar10 - 0xb) && (bVar10 != 4)) {
LAB_0038d71b:
              bVar12 = bVar10;
            }
          }
          else if (bVar10 == 0x11) {
            bVar12 = 9;
          }
          else {
            if (bVar10 != 0x12) goto LAB_0038d71b;
            bVar12 = 10;
          }
        }
        if ((plane == 0) &&
           ((((pMVar7->field_0xa7 & 0x80) != 0 || ('\0' < pMVar7->ref_frame[0])) &&
            (pMVar7->skip_txfm == '\0')))) {
          BVar3 = pMVar7->bsize;
          bVar12 = pMVar7->inter_tx_size
                   [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [BVar3] - 1 & uVar27) >>
                    (av1_get_txb_size_index_tw_w_log2_table[BVar3] & 0x1f)) +
                    (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                            [BVar3] - 1 & uVar19) >>
                     (av1_get_txb_size_index_tw_h_log2_table[BVar3] & 0x1f)) <<
                    (av1_get_txb_size_index_stride_log2_table[BVar3] & 0x1f))];
        }
      }
      else {
        bVar12 = 0;
      }
      *tx_buf = bVar12;
      if (mi_col == 0) {
        iVar21 = 0x40;
      }
      else {
        pMVar8 = ppMVar6[(ulong)uVar14 + ((ulong)uVar27 - lVar25)];
        if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar8->field_0xa7 & 7] == 0)) {
          if (plane == 0) {
            bVar10 = pMVar8->tx_size;
          }
          else {
            bVar11 = ""[av1_ss_size_lookup[pMVar8->bsize][(int)uVar4][(int)uVar5]];
            if (bVar11 < 0x11) {
              bVar10 = 3;
              if ((1 < bVar11 - 0xb) && (bVar11 != 4)) {
LAB_0038d863:
                bVar10 = bVar11;
              }
            }
            else if (bVar11 == 0x11) {
              bVar10 = 9;
            }
            else {
              if (bVar11 != 0x12) goto LAB_0038d863;
              bVar10 = 10;
            }
          }
          if ((plane == 0) &&
             ((((pMVar8->field_0xa7 & 0x80) != 0 || ('\0' < pMVar8->ref_frame[0])) &&
              (pMVar8->skip_txfm == '\0')))) {
            BVar3 = pMVar8->bsize;
            bVar10 = pMVar8->inter_tx_size
                     [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                             [BVar3] - 1 & (-1 << (bVar17 & 0x1f)) + uVar27) >>
                      (av1_get_txb_size_index_tw_w_log2_table[BVar3] & 0x1f)) +
                      (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                              [BVar3] - 1 & uVar19) >>
                       (av1_get_txb_size_index_tw_h_log2_table[BVar3] & 0x1f)) <<
                      (av1_get_txb_size_index_stride_log2_table[BVar3] & 0x1f))];
          }
        }
        else {
          bVar10 = 0;
        }
        iVar21 = tx_size_high[bVar10];
        bVar11 = get_filter_level(cm,lfi_n,0,plane,pMVar7);
        if (bVar11 == 0) {
          bVar11 = get_filter_level(cm,lfi_n,0,plane,pMVar8);
        }
        bVar9 = true;
        if ((pMVar8 == pMVar7) && (pMVar7->skip_txfm != '\0')) {
          if ((pMVar7->field_0xa7 & 0x80) == 0) {
            bVar9 = pMVar7->ref_frame[0] < '\x01';
          }
          else {
            bVar9 = false;
          }
        }
        if ((bool)(bVar11 != 0 & (pMVar8 != pMVar7 | bVar9))) {
          params_buf->filter_length = (uint8_t)vert_filter_length_chroma[bVar12][bVar10];
          params_buf->lfthr = (loop_filter_thresh *)(lfi_n->lfthr[0].mblim + (uint)bVar11 * 0x30);
        }
      }
      iVar16 = tx_size_high[bVar12];
      if (iVar21 < tx_size_high[bVar12]) {
        iVar16 = iVar21;
      }
      uVar28 = (ulong)*tx_buf;
      iVar21 = tx_size_wide_unit[uVar28];
      uVar14 = (iVar21 << (bVar17 & 0x1f)) + mi_col;
      if (uVar14 < uVar26) {
        pbVar23 = tx_buf + iVar21;
        pAVar31 = params_buf + iVar21;
        do {
          pAVar31->filter_length = '\0';
          uVar15 = uVar14 | uVar4;
          uVar20 = (cm->mi_params).mi_stride * uVar19;
          ppMVar6 = (cm->mi_params).mi_grid_base;
          pMVar7 = ppMVar6[(ulong)uVar20 + (ulong)uVar15];
          if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar7->field_0xa7 & 7] == 0))
          {
            if (plane == 0) {
              uVar34 = (ulong)pMVar7->tx_size;
            }
            else {
              bVar12 = ""[av1_ss_size_lookup[pMVar7->bsize][(int)uVar4][(int)uVar5]];
              if (bVar12 < 0x11) {
                uVar34 = 3;
                if ((1 < bVar12 - 0xb) && (bVar12 != 4)) {
LAB_0038da95:
                  uVar34 = (ulong)bVar12;
                }
              }
              else if (bVar12 == 0x11) {
                uVar34 = 9;
              }
              else {
                if (bVar12 != 0x12) goto LAB_0038da95;
                uVar34 = 10;
              }
            }
            if ((plane == 0) &&
               ((((pMVar7->field_0xa7 & 0x80) != 0 || ('\0' < pMVar7->ref_frame[0])) &&
                (pMVar7->skip_txfm == '\0')))) {
              BVar3 = pMVar7->bsize;
              uVar34 = (ulong)pMVar7->inter_tx_size
                              [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                      [BVar3] - 1 & uVar15) >>
                               (av1_get_txb_size_index_tw_w_log2_table[BVar3] & 0x1f)) +
                               (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                       [BVar3] - 1 & uVar19) >>
                                (av1_get_txb_size_index_tw_h_log2_table[BVar3] & 0x1f)) <<
                               (av1_get_txb_size_index_stride_log2_table[BVar3] & 0x1f))];
            }
          }
          else {
            uVar34 = 0;
          }
          *pbVar23 = (byte)uVar34;
          pMVar8 = ppMVar6[(ulong)uVar20 + ((ulong)uVar15 - lVar25)];
          bVar12 = get_filter_level(cm,lfi_n,0,plane,pMVar7);
          if (bVar12 == 0) {
            bVar12 = get_filter_level(cm,lfi_n,0,plane,pMVar8);
          }
          bVar9 = true;
          if ((pMVar8 == pMVar7) && (pMVar7->skip_txfm != '\0')) {
            if ((pMVar7->field_0xa7 & 0x80) == 0) {
              bVar9 = pMVar7->ref_frame[0] < '\x01';
            }
            else {
              bVar9 = false;
            }
          }
          if ((bool)(bVar12 != 0 & (pMVar8 != pMVar7 | bVar9))) {
            pAVar31->filter_length = (uint8_t)vert_filter_length_chroma[uVar34][uVar28];
            pAVar31->lfthr = (loop_filter_thresh *)(lfi_n->lfthr[0].mblim + (uint)bVar12 * 0x30);
          }
          if (tx_size_high[uVar34] <= iVar16) {
            iVar16 = tx_size_high[uVar34];
          }
          uVar28 = (ulong)*pbVar23;
          iVar21 = tx_size_wide_unit[uVar28];
          uVar14 = uVar14 + (iVar21 << (bVar17 & 0x1f));
          pbVar23 = pbVar23 + iVar21;
          pAVar31 = pAVar31 + iVar21;
        } while (uVar14 < uVar26);
      }
      if ((((uVar30 & 3) == 0) && ((int)(uVar30 | 3) < iVar33)) && (0xf < iVar16)) {
        uVar19 = 2;
        uVar14 = 3;
      }
      else {
        uVar19 = 0;
        uVar14 = 0;
        if ((uVar30 & 1) == 0) {
          uVar19 = (uint)(7 < iVar16 && (int)(uVar30 | 1) < iVar33);
          uVar14 = uVar19;
        }
      }
      if (0 < (int)uVar13) {
        iVar21 = 0;
        pAVar31 = params_buf;
        pbVar23 = tx_buf;
        do {
          if (*pbVar23 == 0xff) {
            pAVar31->filter_length = '\0';
            *pbVar23 = 0;
          }
          iVar16 = iVar22 * 4 * uVar30 + iVar21 * 4;
          puVar32 = (plane_ptr->dst).buf + iVar16;
          use_filter_type = (USE_FILTER_TYPE)uVar19;
          if (joint_filter_chroma) {
            _blimit0 = pAVar31->lfthr;
            puVar24 = plane_ptr[1].dst.buf + iVar16;
            if (cm->seq_params->use_highbitdepth == '\0') {
              uVar15 = pAVar31->filter_length - 4;
              uVar15 = uVar15 >> 1 | (uint)((uVar15 & 1) != 0) << 0x1f;
              if (use_filter_type == '\x01') {
                if (uVar15 == 1) {
                  puVar1 = _blimit0->lim;
                  puVar2 = _blimit0->hev_thr;
                  aom_lpf_vertical_6_dual_sse2
                            (puVar32,iVar22,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,
                             puVar2);
                  aom_lpf_vertical_6_dual_sse2
                            (puVar24,iVar22,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,
                             puVar2);
                }
                else if (uVar15 == 0) {
                  puVar1 = _blimit0->lim;
                  puVar2 = _blimit0->hev_thr;
                  aom_lpf_vertical_4_dual_sse2
                            (puVar32,iVar22,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,
                             puVar2);
                  aom_lpf_vertical_4_dual_sse2
                            (puVar24,iVar22,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,
                             puVar2);
                }
              }
              else if (uVar19 == 2) {
                if (uVar15 == 1) {
                  aom_lpf_vertical_6_quad_sse2
                            (puVar32,iVar22,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                  aom_lpf_vertical_6_quad_sse2
                            (puVar24,iVar22,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                }
                else if (uVar15 == 0) {
                  aom_lpf_vertical_4_quad_sse2
                            (puVar32,iVar22,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                  aom_lpf_vertical_4_quad_sse2
                            (puVar24,iVar22,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                }
              }
              else if (uVar15 == 1) {
                aom_lpf_vertical_6_sse2
                          (puVar32,iVar22,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                aom_lpf_vertical_6_sse2
                          (puVar24,iVar22,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
              }
              else if (uVar15 == 0) {
                aom_lpf_vertical_4_sse2
                          (puVar32,iVar22,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                aom_lpf_vertical_4_sse2
                          (puVar24,iVar22,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
              }
            }
            else {
              bd = cm->seq_params->bit_depth;
              s = (uint16_t *)((long)puVar32 * 2);
              s_00 = (uint16_t *)((long)puVar24 * 2);
              uVar15 = pAVar31->filter_length - 4;
              uVar15 = uVar15 >> 1 | (uint)((uVar15 & 1) != 0) << 0x1f;
              if (use_filter_type == '\x01') {
                if (uVar15 == 1) {
                  aom_highbd_lpf_vertical_6_dual_sse2
                            (s,iVar22,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,
                             _blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
LAB_0038e1ac:
                  aom_highbd_lpf_vertical_6_dual_sse2
                            (s_00,iVar22,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,
                             _blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
                }
                else if (uVar15 == 0) {
                  (*aom_highbd_lpf_vertical_4_dual)
                            (s,iVar22,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,
                             _blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
LAB_0038df4f:
                  (*aom_highbd_lpf_vertical_4_dual)
                            (s_00,iVar22,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,
                             _blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
                }
              }
              else if (uVar19 == 2) {
                if (uVar15 == 1) {
                  puVar32 = _blimit0->lim;
                  puVar24 = _blimit0->hev_thr;
                  aom_highbd_lpf_vertical_6_dual_sse2
                            (s,iVar22,_blimit0->mblim,puVar32,puVar24,_blimit0->mblim,puVar32,
                             puVar24,bd);
                  aom_highbd_lpf_vertical_6_dual_sse2
                            (s + lVar29 * 8,iVar22,_blimit0->mblim,puVar32,puVar24,_blimit0->mblim,
                             puVar32,puVar24,bd);
                  aom_highbd_lpf_vertical_6_dual_sse2
                            (s_00,iVar22,_blimit0->mblim,puVar32,puVar24,_blimit0->mblim,puVar32,
                             puVar24,bd);
                  s_00 = s_00 + lVar29 * 8;
                  goto LAB_0038e1ac;
                }
                if (uVar15 == 0) {
                  puVar32 = _blimit0->lim;
                  puVar24 = _blimit0->hev_thr;
                  (*aom_highbd_lpf_vertical_4_dual)
                            (s,iVar22,_blimit0->mblim,puVar32,puVar24,_blimit0->mblim,puVar32,
                             puVar24,bd);
                  (*aom_highbd_lpf_vertical_4_dual)
                            (s + lVar29 * 8,iVar22,_blimit0->mblim,puVar32,puVar24,_blimit0->mblim,
                             puVar32,puVar24,bd);
                  (*aom_highbd_lpf_vertical_4_dual)
                            (s_00,iVar22,_blimit0->mblim,puVar32,puVar24,_blimit0->mblim,puVar32,
                             puVar24,bd);
                  s_00 = s_00 + lVar29 * 8;
                  goto LAB_0038df4f;
                }
              }
              else if (uVar15 == 1) {
                aom_highbd_lpf_vertical_6_sse2
                          (s,iVar22,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
                aom_highbd_lpf_vertical_6_sse2
                          (s_00,iVar22,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
              }
              else if (uVar15 == 0) {
                aom_highbd_lpf_vertical_4_sse2
                          (s,iVar22,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
                aom_highbd_lpf_vertical_4_sse2
                          (s_00,iVar22,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
              }
            }
          }
          else {
            filter_vert(puVar32,iVar22,pAVar31,cm->seq_params,use_filter_type);
          }
          uVar15 = tx_size_wide_unit[*pbVar23];
          iVar21 = iVar21 + uVar15;
          pbVar23 = pbVar23 + uVar15;
          pAVar31 = pAVar31 + uVar15;
        } while (iVar21 < (int)uVar13);
      }
      uVar30 = uVar30 + uVar14 + 1;
    } while ((int)uVar30 < iVar33);
  }
  return;
}

Assistant:

void av1_filter_block_plane_vert_opt_chroma(
    const AV1_COMMON *const cm, const MACROBLOCKD *const xd,
    const MACROBLOCKD_PLANE *const plane_ptr, const uint32_t mi_row,
    const uint32_t mi_col, AV1_DEBLOCKING_PARAMETERS *params_buf,
    TX_SIZE *tx_buf, int plane, bool joint_filter_chroma,
    int num_mis_in_lpf_unit_height_log2) {
  const uint32_t scale_horz = plane_ptr->subsampling_x;
  const uint32_t scale_vert = plane_ptr->subsampling_y;
  const int dst_stride = plane_ptr->dst.stride;
  // Ensure that mi_cols/mi_rows are calculated based on frame dimension aligned
  // to MI_SIZE.
  const int mi_cols =
      ((plane_ptr->dst.width << scale_horz) + MI_SIZE - 1) >> MI_SIZE_LOG2;
  const int mi_rows =
      ((plane_ptr->dst.height << scale_vert) + MI_SIZE - 1) >> MI_SIZE_LOG2;
  const int plane_mi_rows = ROUND_POWER_OF_TWO(mi_rows, scale_vert);
  const int plane_mi_cols = ROUND_POWER_OF_TWO(mi_cols, scale_horz);
  const int y_range =
      AOMMIN((int)(plane_mi_rows - (mi_row >> scale_vert)),
             ((1 << num_mis_in_lpf_unit_height_log2) >> scale_vert));
  const int x_range = AOMMIN((int)(plane_mi_cols - (mi_col >> scale_horz)),
                             (MAX_MIB_SIZE >> scale_horz));
  const ptrdiff_t mode_step = (ptrdiff_t)1 << scale_horz;

  for (int y = 0; y < y_range; y++) {
    const uint32_t curr_y = mi_row + (y << scale_vert);
    const uint32_t x_start = mi_col + (0 << scale_horz);
    const uint32_t x_end = mi_col + (x_range << scale_horz);
    int min_height = tx_size_high[TX_64X64];
    set_lpf_parameters_for_line_chroma(params_buf, tx_buf, cm, xd, VERT_EDGE,
                                       x_start, curr_y, plane_ptr, x_end,
                                       mode_step, scale_horz, scale_vert,
                                       &min_height, plane, joint_filter_chroma);

    AV1_DEBLOCKING_PARAMETERS *params = params_buf;
    TX_SIZE *tx_size = tx_buf;
    int use_filter_type = USE_SINGLE;
    int y_inc = 0;

    if ((y & 3) == 0 && (y + 3) < y_range && min_height >= 16) {
      // If we are on a row which is a multiple of 4, and the minimum height is
      // 16 pixels, then the current and below 3 rows must contain the same tx
      // block. This is because dim 16 can only happen every unit of 4 mi's.
      use_filter_type = USE_QUAD;
      y_inc = 3;
    } else if (y % 2 == 0 && (y + 1) < y_range && min_height >= 8) {
      // If we are on an even row, and the minimum height is 8 pixels, then the
      // current and below rows must contain the same tx block. This is because
      // dim 4 can only happen every unit of 2**0, and 8 every unit of 2**1,
      // etc.
      use_filter_type = USE_DUAL;
      y_inc = 1;
    }

    for (int x = 0; x < x_range;) {
      // inner loop always filter vertical edges in a MI block. If MI size
      // is 8x8, it will filter the vertical edge aligned with a 8x8 block.
      // If 4x4 transform is used, it will then filter the internal edge
      //  aligned with a 4x4 block
      if (*tx_size == TX_INVALID) {
        params->filter_length = 0;
        *tx_size = TX_4X4;
      }

      const int offset = y * MI_SIZE * dst_stride + x * MI_SIZE;
      if (joint_filter_chroma) {
        uint8_t *u_dst = plane_ptr[0].dst.buf + offset;
        uint8_t *v_dst = plane_ptr[1].dst.buf + offset;
        filter_vert_chroma(u_dst, v_dst, dst_stride, params, cm->seq_params,
                           use_filter_type);
      } else {
        uint8_t *dst_ptr = plane_ptr->dst.buf + offset;
        filter_vert(dst_ptr, dst_stride, params, cm->seq_params,
                    use_filter_type);
      }

      // advance the destination pointer
      const uint32_t advance_units = tx_size_wide_unit[*tx_size];
      x += advance_units;
      params += advance_units;
      tx_size += advance_units;
    }
    y += y_inc;
  }
}